

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mcpl_fileutils.c
# Opt level: O2

mcu8str * mctools_impl_view_no_winnamespace(mcu8str *__return_storage_ptr__,mcu8str *path)

{
  uint uVar1;
  char *pcVar2;
  int iVar3;
  
  pcVar2 = path->c_str;
  __return_storage_ptr__->c_str = pcVar2;
  uVar1 = path->size;
  __return_storage_ptr__->size = uVar1;
  __return_storage_ptr__->buflen = uVar1 + 1;
  __return_storage_ptr__->owns_memory = 0;
  iVar3 = mctools_impl_has_winnamespace(path);
  if (iVar3 != 0) {
    __return_storage_ptr__->c_str = pcVar2 + 4;
    __return_storage_ptr__->size = uVar1 - 4;
  }
  return __return_storage_ptr__;
}

Assistant:

mcu8str mctools_impl_view_no_winnamespace( const mcu8str * path )
  {
    //Windows paths starting with "\\?\" are a bit special. For our purposes we
    //simply skip those initial characters. See more on:
    //https://learn.microsoft.com/en-us/windows/win32/fileio/naming-a-file
    mcu8str res = mcu8str_view_str( path );
    if ( mctools_impl_has_winnamespace(path) ) {
      //Begins with "<sep><sep>?<sep>", modify the view:
      res.c_str += 4;
        res.size -= 4;
    }
    return res;
  }